

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O3

int8_t * __thiscall
burst::dynamic_tuple::set_up_creation_place<char>(dynamic_tuple *this,char *object)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = this->m_capacity;
  pcVar2 = (this->m_data)._M_t.
           super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
           super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
           super__Head_base<0UL,_signed_char_*,_false>._M_head_impl;
  uVar3 = this->m_volume;
  if (pcVar2 == (char *)0x0 || uVar4 == uVar3) {
    uVar1 = uVar3 + 2;
    if (uVar4 < uVar1) {
      uVar3 = uVar4 * 2;
      if (uVar4 * 2 <= uVar1) {
        uVar3 = uVar1;
      }
      reallocate(this,uVar3);
      uVar4 = this->m_capacity;
      pcVar2 = (this->m_data)._M_t.
               super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
               super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
               super__Head_base<0UL,_signed_char_*,_false>._M_head_impl;
      uVar3 = this->m_volume;
    }
    if ((uVar4 == uVar3) || (pcVar2 == (char *)0x0)) {
      __assert_fail("creation_place != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/dynamic_tuple.hpp"
                    ,0x1c5,"std::int8_t *burst::dynamic_tuple::force_align(const T &) [T = char]");
    }
  }
  return pcVar2 + uVar3;
}

Assistant:

std::int8_t * set_up_creation_place (const T & object)
        {
            if (auto proposed_creation_place = try_to_align(object))
            {
                return proposed_creation_place;
            }
            else
            {
                reserve(volume() + sizeof(T) + alignof(T));
                return force_align(object);
            }
        }